

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::RadixPartitionedHashTable::Sink
          (RadixPartitionedHashTable *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input,DataChunk *payload_input,unsafe_vector<idx_t> *filter)

{
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  *this_00;
  RadixHTGlobalSinkState *gstate;
  RadixHTLocalSinkState *lstate;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var2;
  type this_01;
  type this_02;
  idx_t iVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> local_38;
  
  gstate = (RadixHTGlobalSinkState *)input->global_state;
  lstate = (RadixHTLocalSinkState *)input->local_state;
  this_00 = &lstate->ht;
  if ((lstate->ht).
      super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl ==
      (GroupedAggregateHashTable *)0x0) {
    CreateHT((RadixPartitionedHashTable *)&stack0xffffffffffffffc8,(ClientContext *)this,
             (idx_t)context->client,(gstate->config).sink_capacity);
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (GroupedAggregateHashTable *)0x0;
    _Var1._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         _Var2._M_head_impl;
    if (_Var1._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
    LOCK();
    (gstate->active_threads).super___atomic_base<unsigned_long>._M_i =
         (gstate->active_threads).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  PopulateGroupChunk(this,&lstate->group_chunk,chunk);
  this_01 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
            ::operator*(this_00);
  GroupedAggregateHashTable::AddChunk(this_01,&lstate->group_chunk,payload_input,filter);
  iVar3 = (gstate->config).sink_capacity;
  auVar5._0_8_ = (double)CONCAT44(0x43300000,(int)iVar3);
  auVar5._8_4_ = (int)(iVar3 >> 0x20);
  auVar5._12_4_ = 0x45300000;
  dVar8 = ((auVar5._8_8_ - 1.9342813113834067e+25) + (auVar5._0_8_ - 4503599627370496.0)) / 1.25;
  uVar4 = (ulong)dVar8;
  if (((long)(dVar8 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4) <=
      this_01->count + 0x800) {
    if ((2 < gstate->number_of_threads) || (((gstate->external)._M_base._M_i & 1U) != 0)) {
      GroupedAggregateHashTable::Abandon(this_01);
      this_02 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                ::operator*(&this_01->partitioned_data);
      iVar3 = PartitionedTupleData::Count(this_02);
      uVar4 = this_01->sink_count;
      if ((0x40000 < uVar4) &&
         (auVar6._8_4_ = (int)(iVar3 >> 0x20), auVar6._0_8_ = iVar3, auVar6._12_4_ = 0x45300000,
         auVar7._8_4_ = (int)(uVar4 >> 0x20), auVar7._0_8_ = uVar4, auVar7._12_4_ = 0x45300000,
         0.95 < ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)iVar3) - 4503599627370496.0)) /
                ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)))) {
        this_01->skip_lookups = true;
      }
    }
    iVar3 = this_01->radix_bits;
    MaybeRepartition(context->client,gstate,lstate);
    if ((iVar3 != this_01->radix_bits) && (this_01->count != 0)) {
      GroupedAggregateHashTable::Abandon(this_01);
      if (((gstate->external)._M_base._M_i & 1U) != 0) {
        GroupedAggregateHashTable::Resize(this_01,(gstate->config).sink_capacity);
        return;
      }
    }
  }
  return;
}

Assistant:

void RadixPartitionedHashTable::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input,
                                     DataChunk &payload_input, const unsafe_vector<idx_t> &filter) const {
	auto &gstate = input.global_state.Cast<RadixHTGlobalSinkState>();
	auto &lstate = input.local_state.Cast<RadixHTLocalSinkState>();
	if (!lstate.ht) {
		lstate.ht = CreateHT(context.client, gstate.config.sink_capacity, gstate.config.GetRadixBits());
		gstate.active_threads++;
	}

	auto &group_chunk = lstate.group_chunk;
	PopulateGroupChunk(group_chunk, chunk);

	auto &ht = *lstate.ht;
	ht.AddChunk(group_chunk, payload_input, filter);

	if (ht.Count() + STANDARD_VECTOR_SIZE < GroupedAggregateHashTable::ResizeThreshold(gstate.config.sink_capacity)) {
		return; // We can fit another chunk
	}

	if (gstate.number_of_threads > RadixHTConfig::GROW_STRATEGY_THREAD_THRESHOLD || gstate.external) {
		// 'Reset' the HT without taking its data, we can just keep appending to the same collection
		// This only works because we never resize the HT
		// We don't do this when running with 1 or 2 threads, it only makes sense when there's many threads
		ht.Abandon();

		// Once we've inserted more than SKIP_LOOKUP_THRESHOLD tuples,
		// and more than UNIQUE_PERCENTAGE_THRESHOLD were unique,
		// we set the HT to skip doing lookups, which makes it blindly append data to the HT.
		// This speeds up adding data, at the cost of no longer de-duplicating.
		// The data will be de-duplicated later anyway
		static constexpr idx_t SKIP_LOOKUP_THRESHOLD = 262144;
		static constexpr double UNIQUE_PERCENTAGE_THRESHOLD = 0.95;
		const auto unique_percentage =
		    static_cast<double>(ht.GetPartitionedData().Count()) / static_cast<double>(ht.GetSinkCount());
		if (ht.GetSinkCount() > SKIP_LOOKUP_THRESHOLD && unique_percentage > UNIQUE_PERCENTAGE_THRESHOLD) {
			ht.SkipLookups();
		}
	}

	// Check if we need to repartition
	const auto radix_bits_before = ht.GetRadixBits();
	MaybeRepartition(context.client, gstate, lstate);
	const auto repartitioned = radix_bits_before != ht.GetRadixBits();

	if (repartitioned && ht.Count() != 0) {
		// We repartitioned, but we didn't clear the pointer table / reset the count because we're on 1 or 2 threads
		ht.Abandon();
		if (gstate.external) {
			ht.Resize(gstate.config.sink_capacity);
		}
	}

	// TODO: combine early and often
}